

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCall.cpp
# Opt level: O0

void __thiscall MockCheckedActualCall::checkExpectations(MockCheckedActualCall *this)

{
  bool bVar1;
  int iVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  MockCheckedExpectedCall *pMVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 local_110 [24];
  MockExpectedObjectDidntHappenFailure failure_1;
  undefined1 local_88 [24];
  MockExpectedParameterDidntHappenFailure failure;
  MockCheckedActualCall *this_local;
  
  if ((this->expectationsChecked_ & 1U) == 0) {
    this->expectationsChecked_ = true;
    failure.super_MockFailure.super_TestFailure.message_.bufferSize_ = (size_t)this;
    if (this->state_ == CALL_IN_PROGRESS) {
      bVar1 = MockExpectedCallsList::hasFinalizedMatchingExpectations
                        (&this->potentiallyMatchingExpectations_);
      if (bVar1) {
        pUVar3 = UtestShell::getCurrent();
        pTVar4 = UtestShell::getCurrentTestTerminator();
        (*pUVar3->_vptr_UtestShell[0x1a])
                  (pUVar3,
                   "Actual call is in progress, but there are finalized matching expectations when checking expectations. This cannot happen."
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockActualCall.cpp"
                   ,0x185,pTVar4);
      }
      pMVar5 = MockExpectedCallsList::removeFirstMatchingExpectation
                         (&this->potentiallyMatchingExpectations_);
      this->matchingExpectation_ = pMVar5;
      if (this->matchingExpectation_ == (MockCheckedExpectedCall *)0x0) {
        bVar1 = MockExpectedCallsList::hasUnmatchingExpectationsBecauseOfMissingParameters
                          (&this->potentiallyMatchingExpectations_);
        if (bVar1) {
          iVar2 = (*(this->super_MockActualCall)._vptr_MockActualCall[0x33])();
          getName((MockCheckedActualCall *)local_88);
          MockExpectedParameterDidntHappenFailure::MockExpectedParameterDidntHappenFailure
                    ((MockExpectedParameterDidntHappenFailure *)(local_88 + 0x10),
                     (UtestShell *)CONCAT44(extraout_var,iVar2),(SimpleString *)local_88,
                     this->allExpectations_,&this->potentiallyMatchingExpectations_);
          SimpleString::~SimpleString((SimpleString *)local_88);
          (*(this->super_MockActualCall)._vptr_MockActualCall[0x37])(this,local_88 + 0x10);
          MockExpectedParameterDidntHappenFailure::~MockExpectedParameterDidntHappenFailure
                    ((MockExpectedParameterDidntHappenFailure *)(local_88 + 0x10));
        }
        else {
          iVar2 = (*(this->super_MockActualCall)._vptr_MockActualCall[0x33])();
          getName((MockCheckedActualCall *)local_110);
          MockExpectedObjectDidntHappenFailure::MockExpectedObjectDidntHappenFailure
                    ((MockExpectedObjectDidntHappenFailure *)(local_110 + 0x10),
                     (UtestShell *)CONCAT44(extraout_var_00,iVar2),(SimpleString *)local_110,
                     this->allExpectations_);
          SimpleString::~SimpleString((SimpleString *)local_110);
          (*(this->super_MockActualCall)._vptr_MockActualCall[0x37])(this,local_110 + 0x10);
          MockExpectedObjectDidntHappenFailure::~MockExpectedObjectDidntHappenFailure
                    ((MockExpectedObjectDidntHappenFailure *)(local_110 + 0x10));
        }
      }
      else {
        (*(this->matchingExpectation_->super_MockExpectedCall)._vptr_MockExpectedCall[0x39])();
        (*(this->super_MockActualCall)._vptr_MockActualCall[0x34])();
        (*(this->matchingExpectation_->super_MockExpectedCall)._vptr_MockExpectedCall[0x36])
                  (this->matchingExpectation_,(ulong)this->callOrder_);
        MockExpectedCallsList::resetActualCallMatchingState(&this->potentiallyMatchingExpectations_)
        ;
      }
    }
    else {
      if (this->state_ == CALL_SUCCEED) {
        (*(this->matchingExpectation_->super_MockExpectedCall)._vptr_MockExpectedCall[0x36])
                  (this->matchingExpectation_,(ulong)this->callOrder_);
      }
      MockExpectedCallsList::resetActualCallMatchingState(&this->potentiallyMatchingExpectations_);
    }
  }
  return;
}

Assistant:

void MockCheckedActualCall::checkExpectations()
{
    if(expectationsChecked_) {
        return;
    }

    expectationsChecked_ = true;

    if (state_ != CALL_IN_PROGRESS) {
        if(state_ == CALL_SUCCEED) {
            matchingExpectation_->callWasMade(callOrder_);
        }
        potentiallyMatchingExpectations_.resetActualCallMatchingState();
        return;
    }

    if (potentiallyMatchingExpectations_.hasFinalizedMatchingExpectations())
        FAIL("Actual call is in progress, but there are finalized matching expectations when checking expectations. This cannot happen."); // LCOV_EXCL_LINE

    matchingExpectation_ = potentiallyMatchingExpectations_.removeFirstMatchingExpectation();
    if (matchingExpectation_) {
        matchingExpectation_->finalizeActualCallMatch();
        callHasSucceeded();
        matchingExpectation_->callWasMade(callOrder_);
        potentiallyMatchingExpectations_.resetActualCallMatchingState();
        return;
    }

    if (potentiallyMatchingExpectations_.hasUnmatchingExpectationsBecauseOfMissingParameters()) {
        MockExpectedParameterDidntHappenFailure failure(getTest(), getName(), allExpectations_, potentiallyMatchingExpectations_);
        failTest(failure);
    }
    else {
        MockExpectedObjectDidntHappenFailure failure(getTest(), getName(), allExpectations_);
        failTest(failure);
    }
}